

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Input.cpp
# Opt level: O0

bool __thiscall Input::cheat(Input *this)

{
  byte bVar1;
  long in_RDI;
  bool local_1;
  
  bVar1 = al_key_down(in_RDI + 8,0xd7);
  if (((bVar1 & 1) == 0) || (bVar1 = al_key_down(in_RDI + 8,0x3e), (bVar1 & 1) == 0)) {
    local_1 = false;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool Input::cheat(void)
{
   if (al_key_down(&kbdstate, ALLEGRO_KEY_LSHIFT)
         && al_key_down(&kbdstate, ALLEGRO_KEY_EQUALS))
      return true;
   else
      return false;
}